

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::IsValid(S2Loop *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  S2Error error;
  S2LogMessage local_70;
  char *local_60;
  long local_58;
  char local_50 [16];
  S2Error local_40;
  
  paVar1 = &local_40.text_.field_2;
  local_40.code_ = OK;
  local_40.text_._M_string_length = 0;
  local_40.text_.field_2._M_local_buf[0] = '\0';
  local_40.text_._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = FindValidationErrorNoIndex(this,&local_40);
  if (!bVar2) {
    bVar2 = s2shapeutil::FindSelfIntersection(&(this->index_).super_S2ShapeIndex,&local_40);
    bVar3 = true;
    if (!bVar2) goto LAB_001fa574;
  }
  if (FLAGS_s2debug == true) {
    S2LogMessage::S2LogMessage
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x83,kError,(ostream *)&std::cerr);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_40.text_._M_dataplus._M_p,
               local_40.text_._M_dataplus._M_p + local_40.text_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_70.stream_,local_60,local_58);
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    S2LogMessage::~S2LogMessage(&local_70);
  }
  bVar3 = false;
LAB_001fa574:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.text_._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.text_._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool S2Loop::IsValid() const {
  S2Error error;
  if (FindValidationError(&error)) {
    S2_LOG_IF(ERROR, FLAGS_s2debug) << error;
    return false;
  }
  return true;
}